

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::B3DImporter::InternReadFile
          (B3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong __new_size;
  long *plVar3;
  runtime_error *prVar4;
  long *plVar5;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rb","");
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_70);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (plVar3 != (long *)0x0) {
    __new_size = (**(code **)(*plVar3 + 0x30))(plVar3);
    if (7 < __new_size) {
      this->_pos = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_buf,__new_size);
      (**(code **)(*plVar3 + 0x10))
                (plVar3,(this->_buf).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,1,__new_size);
      puVar1 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar1) {
        (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar1;
      }
      ReadBB3D(this,pScene);
      (**(code **)(*plVar3 + 8))(plVar3);
      return;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"B3D File is too small.","")
    ;
    std::runtime_error::runtime_error(prVar4,(string *)&local_70);
    *(undefined ***)prVar4 = &PTR__runtime_error_007fd498;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Failed to open B3D file ",pFile);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_70 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(prVar4,(string *)&local_70);
  *(undefined ***)prVar4 = &PTR__runtime_error_007fd498;
  __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void B3DImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler){

#ifdef DEBUG_B3D
    AllocConsole();
    freopen( "conin$","r",stdin );
    freopen( "conout$","w",stdout );
    freopen( "conout$","w",stderr );
    cout<<"Hello world from the B3DImporter!"<<endl;
#endif

    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open B3D file " + pFile + ".");

    // check whether the .b3d file is large enough to contain
    // at least one chunk.
    size_t fileSize = file->FileSize();
    if( fileSize<8 ) throw DeadlyImportError( "B3D File is too small.");

    _pos=0;
    _buf.resize( fileSize );
    file->Read( &_buf[0],1,fileSize );
    _stack.clear();

    ReadBB3D( pScene );
}